

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O3

void __thiscall lodepng::ExtractPNG::readPngHeader(ExtractPNG *this,uchar *in,size_t inlength)

{
  int iVar1;
  
  iVar1 = 0x1b;
  if (((((inlength < 0x1d) || (iVar1 = 0x1c, *in != 0x89)) || (in[1] != 'P')) ||
      (((in[2] != 'N' || (in[3] != 'G')) ||
       ((in[4] != '\r' || ((in[5] != '\n' || (in[6] != '\x1a')))))))) ||
     ((in[7] != '\n' ||
      ((((iVar1 = 0x1d, in[0xc] != 'I' || (in[0xd] != 'H')) || (in[0xe] != 'D')) || (in[0xf] != 'R')
       ))))) {
    this->error = iVar1;
  }
  return;
}

Assistant:

void readPngHeader(const unsigned char* in, size_t inlength) {
    if(inlength < 29) { error = 27; return; } //error: the data length is smaller than the length of the header
    if(in[0] != 137 || in[1] != 80 || in[2] != 78 || in[3] != 71
    || in[4] != 13 || in[5] != 10 || in[6] != 26 || in[7] != 10) { error = 28; return; } //no PNG signature
    //error: it doesn't start with a IHDR chunk!
    if(in[12] != 'I' || in[13] != 'H' || in[14] != 'D' || in[15] != 'R') { error = 29; return; }
  }